

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

shared_ptr<mcc::ControlFlow> __thiscall mcc::Parser::BreakStatement(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TokenType in_ESI;
  shared_ptr<mcc::ControlFlow> sVar2;
  shared_ptr<mcc::Token> token;
  bool local_59;
  long *local_58 [2];
  long local_48 [2];
  shared_ptr<mcc::Token> local_38;
  element_type *local_20;
  
  Consume((Parser *)&local_38,in_ESI);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Expected \';\' after \'break\' statement","");
  Consume((Parser *)&stack0xffffffffffffffd8,in_ESI,(string *)0x6);
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_59 = true;
  this->scanner_ = (Scanner *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mcc::ControlFlow,std::allocator<mcc::ControlFlow>,std::shared_ptr<mcc::Token>&,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->reporter_,(ControlFlow **)this,
             (allocator<mcc::ControlFlow> *)local_58,&local_38,&local_59);
  std::__shared_ptr<mcc::ControlFlow,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<mcc::ControlFlow,mcc::ControlFlow>
            ((__shared_ptr<mcc::ControlFlow,(__gnu_cxx::_Lock_policy)2> *)this,
             (ControlFlow *)this->scanner_);
  _Var1._M_pi = extraout_RDX;
  if ((ErrorReporter *)
      local_38.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (ErrorReporter *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mcc::ControlFlow>)
         sVar2.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ControlFlow> Parser::BreakStatement() {
  std::shared_ptr<Token> token = Consume(TokenType::T_BREAK);
  Consume(TokenType::T_SEMICOLON, "Expected ';' after 'break' statement");
  return std::make_shared<ControlFlow>(token, true);
}